

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

BOOL __thiscall
Memory::Recycler::CollectWithHeuristic<(Memory::CollectionFlags)404852739>(Recycler *this)

{
  ulong uVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  uint uVar5;
  DWORD DVar6;
  undefined4 *puVar7;
  uint currentTickCount_1;
  uint currentTickCount;
  BOOL timed;
  BOOL timedIfInScript;
  BOOL timedIfScriptActive;
  BOOL allocSize;
  BOOL isScriptContextCloseGCPending;
  Recycler *this_local;
  
  BVar4 = GetPartialFlag<(Memory::CollectionFlags)404852739>(this);
  if (BVar4 != 0) {
    if ((this->enablePartialCollect & 1U) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0xe8b,"(enablePartialCollect)","enablePartialCollect");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    if ((this->uncollectedNewPageCountPartialCollect < 0x400) ||
       ((ulong)RecyclerHeuristic::Instance.MaxPartialUncollectedNewPageCount <
        this->uncollectedNewPageCountPartialCollect)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0xe8e,
                         "(this->uncollectedNewPageCountPartialCollect >= RecyclerSweepManager::MinPartialUncollectedNewPageCount && this->uncollectedNewPageCountPartialCollect <= RecyclerHeuristic::Instance.MaxPartialUncollectedNewPageCount)"
                         ,
                         "this->uncollectedNewPageCountPartialCollect >= RecyclerSweepManager::MinPartialUncollectedNewPageCount && this->uncollectedNewPageCountPartialCollect <= RecyclerHeuristic::Instance.MaxPartialUncollectedNewPageCount"
                        );
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    if (this->uncollectedNewPageCountPartialCollect < (this->autoHeap).uncollectedNewPageCount) {
      BVar4 = Collect<(Memory::CollectionFlags)404852739>(this);
      return BVar4;
    }
  }
  uVar1 = (this->autoHeap).uncollectedAllocBytes;
  uVar5 = RecyclerHeuristic::UncollectedAllocBytesCollection();
  if (uVar1 < uVar5) {
    bVar3 = FinishDisposeObjectsWrapped<(Memory::CollectionFlags)404852739>(this);
    this_local._4_4_ = (uint)bVar3;
  }
  else {
    if ((this->autoHeap).uncollectedAllocBytes <
        (ulong)RecyclerHeuristic::Instance.MaxUncollectedAllocBytes) {
      DVar6 = GetTickCount();
      (this->collectionParam).timeDiff = DVar6 - this->tickCountNextCollection;
      if (-1 < (int)(this->tickCountNextCollection - DVar6)) {
        bVar3 = FinishDisposeObjectsWrapped<(Memory::CollectionFlags)404852739>(this);
        return (uint)bVar3;
      }
    }
    else {
      DVar6 = GetTickCount();
      (this->collectionParam).timeDiff = DVar6 - this->tickCountNextCollection;
    }
    this_local._4_4_ = Collect<(Memory::CollectionFlags)270635011>(this);
  }
  return this_local._4_4_;
}

Assistant:

BOOL
Recycler::CollectWithHeuristic()
{
    // CollectHeuristic_Never flag should only be used with exhaustive candidate
    Assert((flags & CollectHeuristic_Never) == 0);

    BOOL isScriptContextCloseGCPending = FALSE;
    const BOOL allocSize = flags & CollectHeuristic_AllocSize;
    const BOOL timedIfScriptActive = flags & CollectHeuristic_TimeIfScriptActive;
    const BOOL timedIfInScript = flags & CollectHeuristic_TimeIfInScript;
    const BOOL timed = (timedIfScriptActive && isScriptActive) || (timedIfInScript && isInScript) || (flags & CollectHeuristic_Time);

    if ((flags & CollectOverride_CheckScriptContextClose) != 0)
    {
        isScriptContextCloseGCPending = this->collectionWrapper->GetIsScriptContextCloseGCPending();
    }

    // If there is a script context close GC pending, we need to do a GC regardless
    // Otherwise, we should check the heuristics to see if a GC is necessary
    if (!isScriptContextCloseGCPending)
    {
#if ENABLE_PARTIAL_GC
        if (GetPartialFlag<flags>())
        {
            Assert(enablePartialCollect);
            Assert(allocSize);
            Assert(this->uncollectedNewPageCountPartialCollect >= RecyclerSweepManager::MinPartialUncollectedNewPageCount
                && this->uncollectedNewPageCountPartialCollect <= RecyclerHeuristic::Instance.MaxPartialUncollectedNewPageCount);

            // PARTIAL-GC-REVIEW: For now, we have only alloc size heuristic
            // Maybe improve this heuristic by looking at how many free pages are in the page allocator.
            if (autoHeap.uncollectedNewPageCount > this->uncollectedNewPageCountPartialCollect)
            {
#ifdef ENABLE_JS_ETW
                if (IS_UNKNOWN_GC_TRIGGER(collectionStartReason))
                {
                    collectionStartReason = ETWEventGCActivationTrigger::ETWEvent_GC_Trigger_Partial_GC_AllocSize_Heuristic;
                }
#endif
                return Collect<flags>();
            }
        }
#endif

        // allocation byte count heuristic, collect every 1 MB allocated
        if (allocSize && (autoHeap.uncollectedAllocBytes < RecyclerHeuristic::UncollectedAllocBytesCollection()))
        {
            return FinishDisposeObjectsWrapped<flags>();
        }

        // time heuristic, allocate every 1000 clock tick, or 64 MB is allocated in a short time
        if (timed && (autoHeap.uncollectedAllocBytes < RecyclerHeuristic::Instance.MaxUncollectedAllocBytes))
        {
            uint currentTickCount = GetTickCount();
#ifdef RECYCLER_TRACE
            collectionParam.timeDiff = currentTickCount - tickCountNextCollection;
#endif
            if ((int)(tickCountNextCollection - currentTickCount) >= 0)
            {
                return FinishDisposeObjectsWrapped<flags>();
            }
        }
#ifdef RECYCLER_TRACE
        else
        {
            uint currentTickCount = GetTickCount();
            collectionParam.timeDiff = currentTickCount - tickCountNextCollection;
        }
#endif
    }

    // Passed all the heuristic, do some GC work, maybe
    return Collect<(CollectionFlags)(flags & ~CollectMode_Partial)>();
}